

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_data.cpp
# Opt level: O3

void __thiscall
duckdb::BufferedData::BufferedData
          (BufferedData *this,Type type,weak_ptr<duckdb::ClientContext,_true> *context_p)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  type context;
  ClientConfig *pCVar2;
  shared_ptr<duckdb::ClientContext,_true> client_context;
  shared_ptr<duckdb::ClientContext,_true> local_20;
  
  this->_vptr_BufferedData = (_func_int **)&PTR__BufferedData_0199a998;
  this->type = type;
  p_Var1 = (context_p->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->context).internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (context_p->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (this->context).internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (context_p->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (context_p->internal).super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)((long)&(this->glock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->glock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->glock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->glock).super___mutex_base._M_mutex + 8) = 0;
  (this->glock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  weak_ptr<duckdb::ClientContext,_true>::lock((weak_ptr<duckdb::ClientContext,_true> *)&local_20);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*(&local_20);
  pCVar2 = ClientConfig::GetConfig(context);
  this->total_buffer_size = pCVar2->streaming_buffer_size;
  if (local_20.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.internal.
               super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

BufferedData::BufferedData(Type type, weak_ptr<ClientContext> context_p) : type(type), context(std::move(context_p)) {
	auto client_context = context.lock();
	auto &config = ClientConfig::GetConfig(*client_context);
	total_buffer_size = config.streaming_buffer_size;
}